

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,size_t numVertices,VertexPacketAllocator *vpalloc)

{
  pointer __n;
  iterator outputIterator;
  allocator<rr::pa::Line> local_59;
  undefined1 local_58 [8];
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> inputPrimitives;
  size_t assemblerPrimitiveCount;
  VertexPacketAllocator *vpalloc_local;
  size_t numVertices_local;
  VertexPacket **vertices_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  __n = (pointer)pa::LineStrip::getPrimitiveCount(numVertices);
  inputPrimitives.super__Vector_base<rr::pa::Line,_std::allocator<rr::pa::Line>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<rr::pa::Line>::allocator(&local_59);
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::vector
            ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_58,(size_type)__n,
             &local_59);
  std::allocator<rr::pa::Line>::~allocator(&local_59);
  outputIterator =
       std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::begin
                 ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_58);
  pa::LineStrip::
  exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
            ((__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
              )outputIterator._M_current,vertices,numVertices,state->provokingVertexConvention);
  (anonymous_namespace)::
  makeSharedVerticesDistinct<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_58,vpalloc);
  (anonymous_namespace)::drawBasicPrimitives<std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>
            (state,renderTarget,program,
             (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_58,vpalloc);
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::~vector
            ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)local_58);
  return;
}

Assistant:

void drawGeometryShaderOutputAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, size_t numVertices, VertexPacketAllocator& vpalloc)
{
	// Run primitive assembly for generated stream

	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType>	inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, numVertices, state.provokingVertexConvention); // \note input Primitives are baseType_t => only basic primitives (non adjacency) will compile

	// Make shared vertices distinct

	makeSharedVerticesDistinct(inputPrimitives, vpalloc);

	// Draw assembled primitives

	drawBasicPrimitives(state, renderTarget, program, inputPrimitives, vpalloc);
}